

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_15::XmlWriter::writeAttribute<doctest::String>
          (XmlWriter *this,string *name,String *attribute)

{
  String *name_00;
  XmlWriter *pXVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream rss;
  ostream local_198;
  String *local_20;
  String *attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  local_20 = attribute;
  attribute_local = (String *)name;
  name_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  doctest::operator<<(&local_198,local_20);
  name_00 = attribute_local;
  std::__cxx11::stringstream::str();
  pXVar1 = writeAttribute(this,(string *)name_00,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
        std::stringstream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }